

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O3

void TestConstExpr::ConstTestT<unsigned_int>(void)

{
  if (ConstTestT<unsigned_int>()::t == '\0') {
    ConstTestT<unsigned_int>();
  }
  if (ConstTestT<unsigned_int>()::b == '\0') {
    ConstTestT<unsigned_int>();
  }
  return;
}

Assistant:

void ConstTestT()
	{
		static const T t = ConstConstructor<T>();
		static const bool b = ConstBool<T>();
	}